

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

void init_cmdline_instance(cmdline_instance *ci)

{
  Conf *pCVar1;
  char *pcVar2;
  
  ci->listen_port = -1;
  ci->listen_socket = (char *)0x0;
  ci->hostkeys = (ssh_key **)0x0;
  ci->nhostkeys = 0;
  ci->hostkeysize = 0;
  ci->hostkey1 = (RSAKey *)0x0;
  pCVar1 = make_ssh_server_conf();
  ci->conf = pCVar1;
  memset(&ci->aps,0,0xd0);
  (ci->ssc).application_name = "Uppity";
  pcVar2 = getenv("HOME");
  (ci->ssc).session_starting_dir = pcVar2;
  (ci->ssc).ssh1_cipher_mask = 0x4c;
  (ci->ssc).ssh1_allow_compression = true;
  ci->auth_methods = 0x3e;
  return;
}

Assistant:

static void init_cmdline_instance(struct cmdline_instance *ci)
{
    ci->listen_port = -1;
    ci->listen_socket = NULL;

    ci->hostkeys = NULL;
    ci->nhostkeys = ci->hostkeysize = 0;
    ci->hostkey1 = NULL;

    ci->conf = make_ssh_server_conf();

    ci->aps.ssh1keys = NULL;
    ci->aps.ssh2keys = NULL;

    memset(&ci->ssc, 0, sizeof(ci->ssc));

    ci->ssc.application_name = "Uppity";
    ci->ssc.session_starting_dir = getenv("HOME");
    ci->ssc.ssh1_cipher_mask = SSH1_SUPPORTED_CIPHER_MASK;
    ci->ssc.ssh1_allow_compression = true;

    ci->auth_methods = (AUTHMETHOD_PUBLICKEY | AUTHMETHOD_PASSWORD |
                        AUTHMETHOD_KBDINT | AUTHMETHOD_TIS |
                        AUTHMETHOD_CRYPTOCARD);
}